

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::reduceedgesatvertex(tetgenmesh *this,point startpt,arraypool *endptlist)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  point pdVar4;
  bool bVar5;
  uint local_d0;
  int j;
  int i;
  int n;
  int count;
  int reduceflag;
  flipconstraints fc;
  interresult dir;
  point *parypt;
  point *pendpt;
  triface searchtet;
  arraypool *endptlist_local;
  point startpt_local;
  tetgenmesh *this_local;
  
  searchtet._8_8_ = endptlist;
  triface::triface((triface *)&pendpt);
  flipconstraints::flipconstraints((flipconstraints *)&count);
  fc.cosdihed_out._0_4_ = 1;
  fc.fac[2] = startpt;
  do {
    i = 0;
    for (local_d0 = 0; (long)(int)local_d0 < *(long *)(searchtet._8_8_ + 0x20);
        local_d0 = local_d0 + 1) {
      plVar3 = (long *)(*(long *)(*(long *)(searchtet._8_8_ + 0x18) +
                                 (long)((int)local_d0 >>
                                       ((byte)*(undefined4 *)(searchtet._8_8_ + 8) & 0x1f)) * 8) +
                       (long)(int)((local_d0 & *(uint *)(searchtet._8_8_ + 0xc)) *
                                  *(int *)searchtet._8_8_));
      if ((point)*plVar3 != this->dummypoint) {
        bVar5 = false;
        if (this->nonconvex == 0) {
          point2tetorg(this,startpt,(triface *)&pendpt);
          fc.remvert._4_4_ = finddirection(this,(triface *)&pendpt,(point)*plVar3);
        }
        else {
          iVar1 = getedge(this,startpt,(point)*plVar3,(triface *)&pendpt);
          if (iVar1 == 0) {
            fc.remvert._4_4_ = INTERSECT;
          }
          else {
            fc.remvert._4_4_ = ACROSSVERT;
          }
        }
        if (fc.remvert._4_4_ == ACROSSVERT) {
          pdVar4 = dest(this,(triface *)&pendpt);
          if ((pdVar4 == (point)*plVar3) &&
             ((pendpt[8] == (point)0x0 || (pendpt[8][ver2edge[(int)searchtet.tet]] == 0.0)))) {
            iVar1 = removeedgebyflips(this,(triface *)&pendpt,(flipconstraints *)&count);
            bVar5 = iVar1 == 2;
          }
        }
        else {
          bVar5 = true;
        }
        if (bVar5) {
          i = i + 1;
          uVar2 = (int)*(undefined8 *)(searchtet._8_8_ + 0x20) - 1;
          *plVar3 = *(long *)(*(long *)(*(long *)(searchtet._8_8_ + 0x18) +
                                       (long)((int)uVar2 >>
                                             ((byte)*(undefined4 *)(searchtet._8_8_ + 8) & 0x1f)) *
                                       8) +
                             (long)(int)((uVar2 & *(uint *)(searchtet._8_8_ + 0xc)) *
                                        *(int *)searchtet._8_8_));
          *(long *)(searchtet._8_8_ + 0x20) = *(long *)(searchtet._8_8_ + 0x20) + -1;
          local_d0 = local_d0 - 1;
        }
      }
    }
  } while (i != 0);
  return (int)*(undefined8 *)(searchtet._8_8_ + 0x20);
}

Assistant:

int tetgenmesh::reduceedgesatvertex(point startpt, arraypool* endptlist)
{
  triface searchtet;
  point *pendpt, *parypt;
  enum interresult dir;
  flipconstraints fc;
  int reduceflag;
  int count;
  int n, i, j;


  fc.remvert = startpt;
  fc.checkflipeligibility = 1;

  while (1) {

    count = 0;

    for (i = 0; i < endptlist->objects; i++) {
      pendpt = (point *) fastlookup(endptlist, i);
      if (*pendpt == dummypoint) {
        continue; // Do not reduce a virtual edge.
      }
      reduceflag = 0;
      // Find the edge.
      if (nonconvex) {
        if (getedge(startpt, *pendpt, &searchtet)) {
          dir = ACROSSVERT;
        } else {
          // The edge does not exist (was flipped).
          dir = INTERSECT;
        }
      } else {
        point2tetorg(startpt, searchtet);
        dir = finddirection(&searchtet, *pendpt);
      }
      if (dir == ACROSSVERT) {
        if (dest(searchtet) == *pendpt) {
          // Do not flip a segment.
          if (!issubseg(searchtet)) {
            n = removeedgebyflips(&searchtet, &fc);
            if (n == 2) {
              reduceflag = 1;
            }
          }
        }
      } else {
        // The edge has been flipped.
        reduceflag = 1;
      }
      if (reduceflag) {
        count++;
        // Move the last vertex into this slot.
        j = endptlist->objects - 1;
        parypt = (point *) fastlookup(endptlist, j);
        *pendpt = *parypt;
        endptlist->objects--;
        i--;
      }
    } // i

    if (count == 0) {
      // No edge is reduced.
      break;
    }

  } // while (1)

  return (int) endptlist->objects;
}